

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complextype.cpp
# Opt level: O3

Token * __thiscall
ComplexType::parseNumber
          (Token *__return_storage_ptr__,ComplexType *this,string *str,char *current,size_t *index)

{
  bool bVar1;
  int iVar2;
  runtime_error *this_00;
  int iVar3;
  bool bVar4;
  size_t sVar5;
  initializer_list<NumericConstantChar> __l;
  NumericChars chars;
  NumericConstantChar local_8a;
  allocator_type local_89;
  vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> local_88;
  NumericConstant local_70;
  NumericConstant local_50;
  
  if (*current == 'i') {
    local_88.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl.
    super__Vector_impl_data._M_start = &local_8a;
    local_8a = ImaginaryUnit;
    local_88.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl.
    super__Vector_impl_data._M_finish = (NumericConstantChar *)0x1;
    NumericConstant::NumericConstant(&local_50,(initializer_list<NumericConstantChar> *)&local_88);
    Token::Token(__return_storage_ptr__,&local_50);
  }
  else {
    local_8a = NumericConstantChars::getChar(*current);
    __l._M_len = 1;
    __l._M_array = &local_8a;
    std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::vector
              (&local_88,__l,&local_89);
    sVar5 = *index + 1;
    if (sVar5 < str->_M_string_length) {
      bVar4 = false;
      do {
        iVar2 = tolower((int)(str->_M_dataplus)._M_p[sVar5]);
        *current = (char)iVar2;
        iVar3 = iVar2 << 0x18;
        if (iVar3 == 0x2e000000) {
          bVar1 = true;
          if (bVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"The token already contains a decimal point.")
            ;
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          if (iVar3 == 0x69000000) {
            *index = sVar5;
            local_8a = ImaginaryUnit;
            if (local_88.
                super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_88.
                super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::
              _M_realloc_insert<NumericConstantChar>
                        (&local_88,
                         (iterator)
                         local_88.
                         super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_8a);
            }
            else {
              *local_88.
               super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl
               .super__Vector_impl_data._M_finish = ImaginaryUnit;
              local_88.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_88.
                   super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            break;
          }
          bVar1 = bVar4;
          if (9 < (iVar3 >> 0x18) - 0x30U) break;
        }
        bVar4 = bVar1;
        local_8a = NumericConstantChars::getChar((char)iVar2);
        if (local_88.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::
          _M_realloc_insert<NumericConstantChar>
                    (&local_88,
                     (iterator)
                     local_88.
                     super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_8a);
        }
        else {
          *local_88.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_8a;
          local_88.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_88.
               super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
        *index = sVar5;
        sVar5 = sVar5 + 1;
      } while (sVar5 < str->_M_string_length);
    }
    NumericConstant::NumericConstant(&local_70,&local_88);
    Token::Token(__return_storage_ptr__,&local_70);
    local_50.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_88.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_50.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_70.mChars.
        super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.mChars.
                      super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.mChars.
                            super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.mChars.
                            super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      local_50.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_88.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_50.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  if (local_50.mChars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
      _M_impl.super__Vector_impl_data._M_start != (NumericConstantChar *)0x0) {
    operator_delete(local_50.mChars.
                    super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.mChars.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.mChars.
                          super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Token ComplexType::parseNumber(std::string& str, char& current, std::size_t& index) const {
	if (current == 'i') {
		return NumericConstant({ NumericConstantChar::ImaginaryUnit });
	}

	NumericChars chars({ NumericConstantChars::getChar(current) });
	bool hasDecimalPoint = false;

	while (true) {
		std::size_t next = index + 1;

		if (next >= str.size()) {
			break;
		}

		current = (char)std::tolower(str[next]);

		if (current == '.') {
			if (!hasDecimalPoint) {
				hasDecimalPoint = true;
			} else {
				throw std::runtime_error("The token already contains a decimal point.");
			}
		} else if (current == 'i') {
			index = next;
			chars.push_back(NumericConstantChar::ImaginaryUnit);
			break;
		} else {
			if (!isdigit(current)) {
				break;
			}
		}

		chars.push_back(NumericConstantChars::getChar(current));
		index = next;
	}

	return NumericConstant(chars);
}